

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fFlushFinishTests.cpp
# Opt level: O2

int __thiscall
deqp::gles3::Functional::anon_unknown_0::FlushFinishCase::init
          (FlushFinishCase *this,EVP_PKEY_CTX *ctx)

{
  RenderContext *renderCtx;
  int iVar1;
  ShaderProgram *pSVar2;
  ProgramSources *pPVar3;
  undefined4 extraout_var;
  TestError *this_00;
  allocator<char> local_182;
  allocator<char> local_181;
  string local_180;
  string local_160;
  undefined1 local_140 [40];
  undefined1 local_118 [40];
  ProgramSources local_f0;
  
  pSVar2 = (ShaderProgram *)operator_new(0xd0);
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&local_f0,0,0xac);
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._0_1_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish._1_7_ = 0;
  local_f0.transformFeedbackVaryings.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage._0_1_ = 0;
  local_f0._193_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_160,
             "#version 300 es\nin highp vec4 a_position;\nout highp vec4 v_coord;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_coord = a_position;\n}\n"
             ,&local_181);
  glu::VertexSource::VertexSource((VertexSource *)local_118,&local_160);
  pPVar3 = glu::ProgramSources::operator<<(&local_f0,(ShaderSource *)local_118);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_180,
             "#version 300 es\nuniform highp int u_numIters;\nin highp vec4 v_coord;\nout mediump vec4 o_color;\nvoid main (void)\n{\n\thighp vec4 color = v_coord;\n\tfor (int i = 0; i < u_numIters; i++)\n\t\tcolor = sin(color);\n\to_color = color;\n}\n"
             ,&local_182);
  glu::FragmentSource::FragmentSource((FragmentSource *)local_140,&local_180);
  pPVar3 = glu::ProgramSources::operator<<(pPVar3,(ShaderSource *)local_140);
  glu::ShaderProgram::ShaderProgram(pSVar2,renderCtx,pPVar3);
  this->m_program = pSVar2;
  std::__cxx11::string::~string((string *)(local_140 + 8));
  std::__cxx11::string::~string((string *)&local_180);
  std::__cxx11::string::~string((string *)(local_118 + 8));
  std::__cxx11::string::~string((string *)&local_160);
  glu::ProgramSources::~ProgramSources(&local_f0);
  if ((this->m_program->m_program).m_info.linkOk == false) {
    glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,
                    this->m_program);
    pSVar2 = this->m_program;
    if (pSVar2 != (ShaderProgram *)0x0) {
      glu::ShaderProgram::~ShaderProgram(pSVar2);
    }
    operator_delete(pSVar2,0xd0);
    this->m_program = (ShaderProgram *)0x0;
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
               ,0xd9);
  }
  else {
    iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
    iVar1 = (**(code **)(CONCAT44(extraout_var,iVar1) + 0xb48))
                      ((this->m_program->m_program).m_program);
    this->m_iterCountLoc = iVar1;
    if (-1 < iVar1) {
      return iVar1;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_iterCountLoc >= 0",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fFlushFinishTests.cpp"
               ,0xdd);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void FlushFinishCase::init (void)
{
	DE_ASSERT(!m_program);

	m_program = new glu::ShaderProgram(m_context.getRenderContext(),
		glu::ProgramSources()
			<< glu::VertexSource(
				"#version 300 es\n"
				"in highp vec4 a_position;\n"
				"out highp vec4 v_coord;\n"
				"void main (void)\n"
				"{\n"
				"	gl_Position = a_position;\n"
				"	v_coord = a_position;\n"
				"}\n")
			<< glu::FragmentSource(
				"#version 300 es\n"
				"uniform highp int u_numIters;\n"
				"in highp vec4 v_coord;\n"
				"out mediump vec4 o_color;\n"
				"void main (void)\n"
				"{\n"
				"	highp vec4 color = v_coord;\n"
				"	for (int i = 0; i < u_numIters; i++)\n"
				"		color = sin(color);\n"
				"	o_color = color;\n"
				"}\n"));

	if (!m_program->isOk())
	{
		m_testCtx.getLog() << *m_program;
		delete m_program;
		m_program = DE_NULL;
		TCU_FAIL("Compile failed");
	}

	m_iterCountLoc = m_context.getRenderContext().getFunctions().getUniformLocation(m_program->getProgram(), "u_numIters");
	TCU_CHECK(m_iterCountLoc >= 0);
}